

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::IsEntryForFieldNumTest_Matcher_Test::TestBody
          (IsEntryForFieldNumTest_Matcher_Test *this)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  AssertionResult *pAVar4;
  char *pcVar5;
  StringMatchResultListener listener;
  AssertionResult gtest_ar;
  int table_field_numbers [3];
  undefined1 local_438 [32];
  undefined1 local_418 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_410;
  FieldEntry *local_408;
  undefined1 local_400 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8;
  MatcherBase<const_std::nullptr_t_&> local_3f0;
  undefined1 local_3d8 [16];
  Buffer local_3c8;
  VTable local_3b8 [3];
  ios_base local_348 [264];
  AssertHelper local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  ostream local_230 [112];
  ios_base local_1c0 [264];
  _func_int *local_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  undefined2 local_a0;
  undefined2 local_9e;
  undefined8 local_9c;
  undefined8 local_94;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined1 auStack_50 [16];
  undefined8 uStack_40;
  undefined1 local_38;
  
  local_438._0_8_ = (long)&uStack_60 + 4;
  local_a8 = 0;
  local_a0 = 0;
  local_9e = 0x48;
  local_9c = 0x70fffffff8;
  local_94 = 0;
  local_68 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_58 = 0;
  auStack_50._0_8_ = 0;
  auStack_50._8_8_ = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_b8 = (_func_int *)0x200000001;
  local_b0 = 3;
  uStack_60 = 0xffffffff;
  local_3d8._8_4_ = 1;
  local_3d8._0_8_ = &local_b8;
  local_3c8.ptr = &local_a8;
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
  ::operator()(&local_240,local_3d8,(FieldEntry **)"&entries[0]");
  if (local_240.data_._0_1_ == (stringstream)0x0) {
    testing::Message::Message((Message *)local_3d8);
    if (local_238 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_238->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x136,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_438,(Message *)local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_438);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(_func_int **)local_3d8._0_8_ + 8))();
    }
  }
  if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_238,local_238);
  }
  local_3d8._8_4_ = 3;
  local_438._0_8_ = auStack_50 + 0xc;
  local_3d8._0_8_ = &local_b8;
  local_3c8.ptr = &local_a8;
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
  ::operator()(&local_240,local_3d8,(FieldEntry **)"&entries[2]");
  if (local_240.data_._0_1_ == (stringstream)0x0) {
    testing::Message::Message((Message *)local_3d8);
    if (local_238 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_238->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x137,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_438,(Message *)local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_438);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(_func_int **)local_3d8._0_8_ + 8))();
    }
  }
  if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_238,local_238);
  }
  local_408 = (FieldEntry *)auStack_50;
  puVar2 = (undefined8 *)operator_new(0x20);
  puVar3 = (undefined8 *)operator_new(0x20);
  *puVar3 = &PTR__MatcherDescriberInterface_0189b710;
  ((Buffer *)(puVar3 + 1))->ptr = &local_a8;
  *(undefined4 *)(puVar3 + 2) = 3;
  puVar3[3] = &local_b8;
  local_3d8._8_8_ =
       testing::internal::
       MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry*const&>::
       GetVTable<testing::internal::MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry*const&>::ValuePolicy<testing::MatcherInterface<google::protobuf::internal::TcParseTableBase::FieldEntry*const&>const*,true>>()
       ::kVTable;
  local_3c8.ptr = operator_new(0x10);
  ((local_3c8.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_3c8.i + 8) = puVar3;
  local_3d8._0_8_ = &PTR__MatcherBase_0189bd28;
  *puVar2 = &PTR__NotMatcherImpl_0189be18;
  puVar2[2] = testing::internal::
              MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry*const&>::
              GetVTable<testing::internal::MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry*const&>::ValuePolicy<testing::MatcherInterface<google::protobuf::internal::TcParseTableBase::FieldEntry*const&>const*,true>>()
              ::kVTable;
  ((Buffer *)(puVar2 + 3))->shared = (SharedPayloadBase *)local_3c8;
  LOCK();
  ((local_3c8.shared)->ref).super___atomic_base<int>._M_i =
       ((local_3c8.shared)->ref).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  puVar2[1] = &PTR__MatcherBase_0189bd28;
  local_3f0.vtable_ =
       (VTable *)
       testing::internal::
       MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry*const&>::
       GetVTable<testing::internal::MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry*const&>::ValuePolicy<testing::MatcherInterface<google::protobuf::internal::TcParseTableBase::FieldEntry*const&>const*,true>>()
       ::kVTable;
  local_3f0.buffer_.ptr = operator_new(0x10);
  ((local_3f0.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_3f0.buffer_.i + 8) = puVar2;
  local_3f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0189bd28;
  testing::internal::MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
  ::~MatcherBase((MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *)
                 local_3d8);
  local_3d8._8_8_ = (VTable *)0x0;
  local_3d8._0_8_ = &PTR__MatchResultListener_01870a48;
  bVar1 = testing::internal::
          MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>::
          MatchAndExplain((MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
                           *)&local_3f0,&local_408,(MatchResultListener *)local_3d8);
  if (bVar1) {
    testing::AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_240);
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"Value of: ",10);
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"&entries[1]",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"Expected: ",10);
    testing::internal::
    MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>::DescribeTo
              ((MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *)
               &local_3f0,local_230);
    local_3d8._8_8_ = local_3b8;
    local_3d8._0_8_ = &PTR__StringMatchResultListener_01870a90;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_3d8 + 0x10));
    bVar1 = testing::internal::
            MatchPrintAndExplain<google::protobuf::internal::TcParseTableBase::FieldEntry*const,google::protobuf::internal::TcParseTableBase::FieldEntry*const&>
                      (&local_408,
                       (Matcher<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *
                       )&local_3f0,(MatchResultListener *)local_3d8);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_230,
                 "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                 ,0x60);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"\n  Actual: ",0xb);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (local_230,(char *)local_438._0_8_,local_438._8_8_);
    if ((AssertHelperData *)local_438._0_8_ != (AssertHelperData *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    testing::AssertionFailure();
    std::__cxx11::stringbuf::str();
    pAVar4 = testing::AssertionResult::operator<<
                       ((AssertionResult *)local_400,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_438);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_418,pAVar4);
    if ((AssertHelperData *)local_438._0_8_ != (AssertHelperData *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    if (local_3f8._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_400 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_3f8._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_3d8._0_8_ = &PTR__StringMatchResultListener_01870a90;
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_3d8 + 0x10));
    std::ios_base::~ios_base(local_348);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_240);
    std::ios_base::~ios_base(local_1c0);
  }
  testing::internal::MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
  ::~MatcherBase((MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *)
                 &local_3f0);
  if (local_418[0] == false) {
    testing::Message::Message((Message *)local_3d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_410._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = *(char **)local_410._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x139,pcVar5);
    testing::internal::AssertHelper::operator=(&local_240,(Message *)local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_3d8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_3d8._0_8_ + 8))();
    }
  }
  if (local_410._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_410._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  }
  local_408 = (FieldEntry *)0x0;
  puVar2 = (undefined8 *)operator_new(0x20);
  puVar3 = (undefined8 *)operator_new(0x20);
  *puVar3 = &PTR__MatcherDescriberInterface_0189b760;
  ((Buffer *)(puVar3 + 1))->ptr = &local_a8;
  *(undefined4 *)(puVar3 + 2) = 1;
  puVar3[3] = &local_b8;
  local_3d8._8_8_ =
       testing::internal::MatcherBase<decltype(nullptr)const&>::
       GetVTable<testing::internal::MatcherBase<decltype(nullptr)const&>::ValuePolicy<testing::MatcherInterface<decltype(nullptr)const&>const*,true>>()
       ::kVTable;
  local_3c8.ptr = operator_new(0x10);
  ((local_3c8.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_3c8.i + 8) = puVar3;
  local_3d8._0_8_ = &PTR__MatcherBase_0189bed0;
  *puVar2 = &PTR__NotMatcherImpl_0189be80;
  puVar2[2] = testing::internal::MatcherBase<decltype(nullptr)const&>::
              GetVTable<testing::internal::MatcherBase<decltype(nullptr)const&>::ValuePolicy<testing::MatcherInterface<decltype(nullptr)const&>const*,true>>()
              ::kVTable;
  ((Buffer *)(puVar2 + 3))->shared = (SharedPayloadBase *)local_3c8;
  LOCK();
  ((local_3c8.shared)->ref).super___atomic_base<int>._M_i =
       ((local_3c8.shared)->ref).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  puVar2[1] = &PTR__MatcherBase_0189bed0;
  local_3f0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<decltype(nullptr)const&>::
       GetVTable<testing::internal::MatcherBase<decltype(nullptr)const&>::ValuePolicy<testing::MatcherInterface<decltype(nullptr)const&>const*,true>>()
       ::kVTable;
  local_3f0.buffer_.ptr = operator_new(0x10);
  ((local_3f0.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_3f0.buffer_.i + 8) = puVar2;
  local_3f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0189bed0;
  testing::internal::MatcherBase<const_std::nullptr_t_&>::~MatcherBase
            ((MatcherBase<const_std::nullptr_t_&> *)local_3d8);
  local_3d8._8_8_ = (VTable *)0x0;
  local_3d8._0_8_ = &PTR__MatchResultListener_01870a48;
  bVar1 = testing::internal::MatcherBase<const_std::nullptr_t_&>::MatchAndExplain
                    (&local_3f0,&local_408,(MatchResultListener *)local_3d8);
  if (bVar1) {
    testing::AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_240);
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"Value of: ",10);
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"nullptr",7);
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"Expected: ",10);
    testing::internal::MatcherBase<const_std::nullptr_t_&>::DescribeTo(&local_3f0,local_230);
    local_3d8._8_8_ = local_3b8;
    local_3d8._0_8_ = &PTR__StringMatchResultListener_01870a90;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_3d8 + 0x10));
    bVar1 = testing::internal::MatchPrintAndExplain<decltype(nullptr)const,decltype(nullptr)const&>
                      (&local_408,(Matcher<const_std::nullptr_t_&> *)&local_3f0,
                       (MatchResultListener *)local_3d8);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_230,
                 "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                 ,0x60);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_230,"\n  Actual: ",0xb);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (local_230,(char *)local_438._0_8_,local_438._8_8_);
    if ((AssertHelperData *)local_438._0_8_ != (AssertHelperData *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    testing::AssertionFailure();
    std::__cxx11::stringbuf::str();
    pAVar4 = testing::AssertionResult::operator<<
                       ((AssertionResult *)local_400,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_438);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_418,pAVar4);
    if ((AssertHelperData *)local_438._0_8_ != (AssertHelperData *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_3f8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_400 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_3f8._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_3d8._0_8_ = &PTR__StringMatchResultListener_01870a90;
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_3d8 + 0x10));
    std::ios_base::~ios_base(local_348);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_240);
    std::ios_base::~ios_base(local_1c0);
  }
  testing::internal::MatcherBase<const_std::nullptr_t_&>::~MatcherBase(&local_3f0);
  if (local_418[0] == false) {
    testing::Message::Message((Message *)local_3d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_410._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = *(char **)local_410._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x13b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_240,(Message *)local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_3d8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_3d8._0_8_ + 8))();
    }
  }
  if (local_410._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_410._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  }
  return;
}

Assistant:

TEST(IsEntryForFieldNumTest, Matcher) {
  // clang-format off
  TcParseTable<0, 3, 0, 0, 2> table = {
      // header:
      {
          0, 0,  // has_bits_offset, extensions
          0,     // max_field_number
          0,     // fast_idx_mask,
          offsetof(decltype(table), field_lookup_table),
          0xFFFFFFFF - 7,  // 7 = fields 1, 2, and 3.
          offsetof(decltype(table), field_names),
          0,           // num_field_entries
          0, 0,        // num_aux_entries, aux_offset,
          nullptr,     // default instance
          nullptr,     // post_loop_handler
          nullptr,     // fallback function
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          nullptr,     // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
      }};
  // clang-format on
  int table_field_numbers[] = {1, 2, 3};
  table.field_lookup_table = {{65535, 65535}};

  auto& entries = table.field_entries;
  EXPECT_THAT(&entries[0], IsEntryForFieldNum(&table, 1, table_field_numbers));
  EXPECT_THAT(&entries[2], IsEntryForFieldNum(&table, 3, table_field_numbers));
  EXPECT_THAT(&entries[1],
              Not(IsEntryForFieldNum(&table, 3, table_field_numbers)));

  EXPECT_THAT(nullptr, Not(IsEntryForFieldNum(&table, 1, table_field_numbers)));
}